

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O1

void __thiscall libtorrent::dht::dht_tracker::update_storage_node_ids(dht_tracker *this)

{
  _Base_ptr p_Var1;
  _Rb_tree_node_base *p_Var2;
  vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> ids;
  void *local_38;
  digest32<160L> *pdStack_30;
  digest32<160L> *local_28;
  
  local_38 = (void *)0x0;
  pdStack_30 = (digest32<160L> *)0x0;
  local_28 = (digest32<160L> *)0x0;
  for (p_Var2 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    if (pdStack_30 == local_28) {
      std::vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>::
      _M_realloc_insert<libtorrent::digest32<160l>const&>
                ((vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>> *)
                 &local_38,(iterator)pdStack_30,(digest32<160L> *)&p_Var2[4]._M_left);
    }
    else {
      (pdStack_30->m_number)._M_elems[4] = p_Var2[5]._M_color;
      p_Var1 = p_Var2[4]._M_right;
      *(_Base_ptr *)(pdStack_30->m_number)._M_elems = p_Var2[4]._M_left;
      *(_Base_ptr *)((pdStack_30->m_number)._M_elems + 2) = p_Var1;
      pdStack_30 = pdStack_30 + 1;
    }
  }
  (*this->m_storage->_vptr_dht_storage_interface[2])(this->m_storage,&local_38);
  if (local_38 != (void *)0x0) {
    operator_delete(local_38,(long)local_28 - (long)local_38);
  }
  return;
}

Assistant:

void dht_tracker::update_storage_node_ids()
	{
		std::vector<sha1_hash> ids;
		for (auto& n : m_nodes)
			ids.push_back(n.second.dht.nid());
		m_storage.update_node_ids(ids);
	}